

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutTests.cpp
# Opt level: O0

offset_in_this_suite_class_to_subr
agge::tests::LayoutTests::__ConsequentWordBreakWorkWhenNextWordIsFound_meta(char **name)

{
  char **name_local;
  
  *name = "ConsequentWordBreakWorkWhenNextWordIsFound";
  return (offset_in_this_suite_class_to_subr)ConsequentWordBreakWorkWhenNextWordIsFound;
}

Assistant:

test( ConsequentWordBreakWorkWhenNextWordIsFound )
			{
				// INIT
				mocks::font_accessor::char_to_index indices[] = { { L' ', 0 }, { L'A', 1 }, { L'B', 2 }, { L'C', 3 }, { L'D', 4 }, };
				mocks::font_accessor::glyph glyphs[] = {
					{ { 3, 0 } },
					{ { 5, 0 } },
					{ { 7, 0 } },
					{ { 11, 0 } },
					{ { 13, 0 } },
				};
				factory_ptr f = create_single_font_factory(c_fm1, indices, glyphs);
				layout l;

				// ACT
				// 36 + 3 + 61
				// ABCD|ABCDCD[]C
				l.process(R("ABCD ABCDCDC"), limit::wrap(60.0f), *f);

				// ASSERT
				assert_equal(plural
					+ ref_text_line(0.0f, 10.0f, 0.0f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 1 + 2 + 3 + 4))
					+ ref_text_line(0.0f, 24.0f, 0.0f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 1 + 2 + 3 + 4 + 3 + 4))
					+ ref_text_line(0.0f, 38.0f, 0.0f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 3)),
					mkvector(l.begin(), l.end()));
			}